

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatch.cpp
# Opt level: O3

int BmatchCommandInitTwoCircuits(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint verbose;
  int fDelete2;
  int fDelete1;
  timespec ts;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  
  verbose = 0;
  fDelete1 = 0;
  fDelete2 = 0;
  iVar2 = clock_gettime(3,(timespec *)&ts);
  if (iVar2 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  Extra_UtilGetoptReset();
  bVar1 = false;
  do {
    while( true ) {
      while( true ) {
        while (iVar2 = Extra_UtilGetopt(argc,argv,"aAvVdRITh"), 0x55 < iVar2) {
          if (iVar2 < 100) {
            if (iVar2 == 0x56) {
              verbose = verbose | 4;
            }
            else {
              if (iVar2 != 0x61) goto LAB_007b7ade;
              verbose = verbose | 3;
            }
          }
          else if (iVar2 == 100) {
            verbose = verbose | 8;
          }
          else {
            if (iVar2 != 0x76) goto LAB_007b7ade;
            verbose = verbose | 1;
          }
        }
        if (0x51 < iVar2) break;
        if (iVar2 == 0x41) {
          verbose = verbose | 0xf;
        }
        else {
          if (iVar2 != 0x49) {
            if (iVar2 == -1) {
              if (argc - globalUtilOptind == 2) {
                iVar2 = Abc_NtkPrepareTwoNtks
                                  (_stdout,(Abc_Ntk_t *)0x0,argv + globalUtilOptind,2,&pNtk1,&pNtk2,
                                   &fDelete1,&fDelete2);
                if (iVar2 == 0) {
                  return 1;
                }
                Bmatch_PrepNtks(pAbc,pNtk1,pNtk2,verbose);
                if (bVar1) {
                  Abc_Print(1,"%s =","Total runtime");
                  iVar2 = clock_gettime(3,(timespec *)&ts);
                  if (iVar2 < 0) {
                    lVar4 = -1;
                  }
                  else {
                    lVar4 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                  }
                  Abc_Print(1,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
                  return 0;
                }
                return 0;
              }
              puts("Invalid command!");
            }
            goto LAB_007b7ade;
          }
          verbose = verbose | 0x20;
        }
      }
      if (iVar2 != 0x52) break;
      verbose = verbose | 0x10;
    }
    bVar1 = true;
  } while (iVar2 == 0x54);
LAB_007b7ade:
  Abc_Print(-2,"usage: bmatchInit [-aAvVdRIT] <file1> <file2> \n");
  Abc_Print(-2,"       -v verbose \n");
  Abc_Print(-2,"       -a all verbose \n");
  Abc_Print(-2,"       -V supp information \n");
  Abc_Print(-2,"       -A All message \n");
  Abc_Print(-2,"       -d debug message \n");
  Abc_Print(-2,"       -R Resync cir1 & cir2 \n");
  Abc_Print(-2,"       -I show PI information \n");
  Abc_Print(-2,"       -T Print time information \n");
  return 1;
}

Assistant:

int BmatchCommandInitTwoCircuits( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fDelete1 = 0, fDelete2 = 0;
    char ** pArgvNew;
    int nArgcNew;
    Abc_Ntk_t * pNtk1, * pNtk2;
    int pVerbose = 0, pTime = 0;
    abctime clkTotal = Abc_Clock();
 
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "aAvVdRITh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'v':   pVerbose |= 1;  break;
            case 'a':   pVerbose |= 3;  break;
            case 'V':   pVerbose |= 4;  break;
            case 'd':   pVerbose |= 8;  break;
            case 'A':   pVerbose |= 15; break;
            case 'R':   pVerbose |= 16; break;
            case 'I':   pVerbose |= 32; break;
            case 'T':   pTime = 1;      break;
            default:    goto usage;
        }
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if( nArgcNew != 2 )
    {
        printf("Invalid command!\n");
        goto usage;
    }
    if ( !Abc_NtkPrepareTwoNtks( stdout, NULL, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2 ) )
        return 1;

    Bmatch_PrepNtks( pAbc, pNtk1, pNtk2, pVerbose );
    
    if( pTime )
        ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );

    return 0;

usage:
    Abc_Print( -2, "usage: bmatchInit [-aAvVdRIT] <file1> <file2> \n" );
    Abc_Print( -2, "       -v verbose \n" );
    Abc_Print( -2, "       -a all verbose \n" );
    Abc_Print( -2, "       -V supp information \n" );
    Abc_Print( -2, "       -A All message \n" );
    Abc_Print( -2, "       -d debug message \n" );
    Abc_Print( -2, "       -R Resync cir1 & cir2 \n" );
    Abc_Print( -2, "       -I show PI information \n" );
    Abc_Print( -2, "       -T Print time information \n" );
    return 1;
}